

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.cpp
# Opt level: O1

bool __thiscall
GGSock::Unserialize::operator()
          (Unserialize *this,uint32_t *obj,char *bufferData,size_t bufferSize,size_t *offset)

{
  ulong uVar1;
  
  uVar1 = *offset + 4;
  if (uVar1 <= bufferSize) {
    *obj = *(uint32_t *)(bufferData + *offset);
    *offset = *offset + 4;
    this->nBytesProcessed = this->nBytesProcessed + 4;
  }
  return uVar1 <= bufferSize;
}

Assistant:

inline bool unserialize_fundamental(T & obj, const char * bufferData, size_t bufferSize, size_t & offset, GGSock::Unserialize & op) noexcept {
            static_assert(std::is_fundamental<T>::value, "Fundamental type required");

            auto osize = sizeof(obj);

            if (offset + osize > bufferSize) return false;

            std::memcpy(reinterpret_cast<char *>(&obj), bufferData + offset, osize);
            ::advance(offset, osize, op);

            return true;
        }